

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

void __thiscall dja::mat4::mat4(mat4 *this,float_t diag)

{
  this->m[0].x = diag;
  this->m[0].y = 0.0;
  this->m[0].z = 0.0;
  *(undefined8 *)&this->m[0].w = 0;
  this->m[1].y = diag;
  this->m[1].z = 0.0;
  this->m[1].w = 0.0;
  this->m[2].x = 0.0;
  this->m[2].y = 0.0;
  this->m[2].z = diag;
  *(undefined8 *)&this->m[2].w = 0;
  this->m[3].y = 0.0;
  this->m[3].z = 0.0;
  this->m[3].w = diag;
  return;
}

Assistant:

mat4::mat4(float_t diag)
{
    m[0] = vec4(diag, 0, 0, 0);
    m[1] = vec4(0, diag, 0, 0);
    m[2] = vec4(0, 0, diag, 0);
    m[3] = vec4(0, 0, 0, diag);
}